

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::handleElementPSVI
          (AbstractDOMParser *this,XMLCh *localName,XMLCh *uri,PSVIElement *elementInfo)

{
  DOMDocumentImpl *pDVar1;
  PSVIHandler *pPVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  DOMTypeInfoImpl *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  DOMDocument *doc;
  
  if (this->fCreateSchemaInfo == true) {
    doc = &this->fDocument->super_DOMDocument;
    if (this->fDocument == (DOMDocumentImpl *)0x0) {
      doc = (DOMDocument *)0x0;
    }
    this_00 = (DOMTypeInfoImpl *)operator_new(0x48,doc);
    DOMTypeInfoImpl::DOMTypeInfoImpl(this_00,(XMLCh *)0x0,(XMLCh *)0x0);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])
              (this_00,0,(ulong)(elementInfo->super_PSVIItem).fValidityState);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])
              (this_00,1,(ulong)(elementInfo->super_PSVIItem).fAssessmentType);
    iVar5 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])(elementInfo);
    if (CONCAT44(extraout_var,iVar5) == 0) {
      if ((elementInfo->super_PSVIItem).fValidityState == VALIDITY_VALID) {
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,2,0xf);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,0);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                  (this_00,4,SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                  (this_00,3,SchemaSymbols::fgATTVAL_ANYTYPE);
      }
    }
    else {
      iVar5 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])(elementInfo);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])
                (this_00,2,(ulong)*(uint *)(CONCAT44(extraout_var_00,iVar5) + 0x28));
      iVar5 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])(elementInfo);
      bVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x38))
                        ((long *)CONCAT44(extraout_var_01,iVar5));
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,(ulong)bVar3);
      pDVar1 = this->fDocument;
      iVar5 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])(elementInfo);
      pXVar6 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x18))
                                  ((long *)CONCAT44(extraout_var_02,iVar5));
      pXVar6 = DOMDocumentImpl::getPooledString(pDVar1,pXVar6);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,4,pXVar6);
      pDVar1 = this->fDocument;
      iVar5 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])(elementInfo);
      pXVar6 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0x10))
                                  ((long *)CONCAT44(extraout_var_03,iVar5));
      pXVar6 = DOMDocumentImpl::getPooledString(pDVar1,pXVar6);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,3,pXVar6);
    }
    iVar5 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])(elementInfo);
    if (CONCAT44(extraout_var_04,iVar5) != 0) {
      iVar5 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])(elementInfo);
      bVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar5) + 0x38))
                        ((long *)CONCAT44(extraout_var_05,iVar5));
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,9,(ulong)bVar3);
      pDVar1 = this->fDocument;
      iVar5 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])(elementInfo);
      pXVar6 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 0x18))
                                  ((long *)CONCAT44(extraout_var_06,iVar5));
      pXVar6 = DOMDocumentImpl::getPooledString(pDVar1,pXVar6);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,8,pXVar6);
      pDVar1 = this->fDocument;
      iVar5 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])(elementInfo);
      pXVar6 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar5) + 0x10))
                                  ((long *)CONCAT44(extraout_var_07,iVar5));
      pXVar6 = DOMDocumentImpl::getPooledString(pDVar1,pXVar6);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,7,pXVar6);
    }
    if (elementInfo->fElementDecl != (XSElementDeclaration *)0x0) {
      bVar4 = XSElementDeclaration::getNillable(elementInfo->fElementDecl);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,6,(ulong)bVar4);
    }
    pXVar6 = DOMDocumentImpl::getPooledString
                       (this->fDocument,(elementInfo->super_PSVIItem).fDefaultValue);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,10,pXVar6);
    pXVar6 = DOMDocumentImpl::getPooledString
                       (this->fDocument,(elementInfo->super_PSVIItem).fNormalizedValue);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,0xb,pXVar6);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,0xc,1);
    (*this->fCurrentParent->_vptr_DOMNode[0x4d])(this->fCurrentParent,this_00);
  }
  pPVar2 = this->fPSVIHandler;
  if (pPVar2 != (PSVIHandler *)0x0) {
    (*pPVar2->_vptr_PSVIHandler[2])(pPVar2,localName,uri,elementInfo);
    return;
  }
  return;
}

Assistant:

void AbstractDOMParser::handleElementPSVI(const XMLCh* const            localName
                                        , const XMLCh* const            uri
                                        ,       PSVIElement *           elementInfo)
{
    // associate the info now; if the user wants, she can override what we did
    if(fCreateSchemaInfo)
    {
        DOMTypeInfoImpl* typeInfo=new (getDocument()) DOMTypeInfoImpl();
        typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validity, elementInfo->getValidity());
        typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validation_Attempted, elementInfo->getValidationAttempted());
        if(elementInfo->getTypeDefinition())
        {
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, elementInfo->getTypeDefinition()->getTypeCategory());
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, elementInfo->getTypeDefinition()->getAnonymous());
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace,
                fDocument->getPooledString(elementInfo->getTypeDefinition()->getNamespace()));
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name,
                fDocument->getPooledString(elementInfo->getTypeDefinition()->getName()));
        }
        else if(elementInfo->getValidity()==PSVIItem::VALIDITY_VALID)
        {
            // if we are valid but we don't have a type validator, we are xs:anyType
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, XSTypeDefinition::COMPLEX_TYPE);
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, false);
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name, SchemaSymbols::fgATTVAL_ANYTYPE);
        }
        if(elementInfo->getMemberTypeDefinition())
        {
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Anonymous, elementInfo->getMemberTypeDefinition()->getAnonymous());
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Namespace,
                fDocument->getPooledString(elementInfo->getMemberTypeDefinition()->getNamespace()));
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Name,
                fDocument->getPooledString(elementInfo->getMemberTypeDefinition()->getName()));
        }
        if(elementInfo->getElementDeclaration())
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Nil, elementInfo->getElementDeclaration()->getNillable());
        typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Default, fDocument->getPooledString(elementInfo->getSchemaDefault()));
        typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Normalized_Value, fDocument->getPooledString(elementInfo->getSchemaNormalizedValue()));
        typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Schema_Specified, true);
        ((DOMElementNSImpl*)fCurrentParent)->setSchemaTypeInfo(typeInfo);
    }
    if(fPSVIHandler)
        fPSVIHandler->handleElementPSVI(localName, uri, elementInfo);
}